

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O3

MatrixFixSize<4U,_3U> * iDynTree::Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)

{
  MatrixFixSize<4U,_3U> *in_RDI;
  double dVar1;
  double dVar2;
  
  dVar1 = -quaternion.m_data[3];
  in_RDI->m_data[2] = dVar1;
  in_RDI->m_data[3] = 1.0;
  in_RDI->m_data[6] = 0.0;
  in_RDI->m_data[4] = 0.0;
  in_RDI->m_data[5] = 0.0;
  in_RDI->m_data[7] = 1.0;
  in_RDI->m_data[10] = 0.0;
  in_RDI->m_data[8] = 0.0;
  in_RDI->m_data[9] = 0.0;
  dVar2 = quaternion.m_data[0] * 0.0;
  in_RDI->m_data[3] = in_RDI->m_data[3] * quaternion.m_data[0] - 0.0;
  in_RDI->m_data[4] = in_RDI->m_data[4] * quaternion.m_data[0] - dVar1;
  in_RDI->m_data[5] = dVar2 - quaternion.m_data[2];
  in_RDI->m_data[6] = dVar2 - quaternion.m_data[3];
  in_RDI->m_data[7] = in_RDI->m_data[7] * quaternion.m_data[0] - 0.0;
  in_RDI->m_data[8] = in_RDI->m_data[8] * quaternion.m_data[0] - -quaternion.m_data[1];
  in_RDI->m_data[9] = dVar2 - -quaternion.m_data[2];
  in_RDI->m_data[10] = dVar2 - quaternion.m_data[1];
  in_RDI->m_data[0xb] = quaternion.m_data[0];
  in_RDI->m_data[0] = -quaternion.m_data[1] * 0.5;
  in_RDI->m_data[1] = -quaternion.m_data[2] * 0.5;
  in_RDI->m_data[2] = in_RDI->m_data[2] * 0.5;
  in_RDI->m_data[3] = in_RDI->m_data[3] * 0.5;
  in_RDI->m_data[4] = in_RDI->m_data[4] * 0.5;
  in_RDI->m_data[5] = in_RDI->m_data[5] * 0.5;
  in_RDI->m_data[6] = in_RDI->m_data[6] * 0.5;
  in_RDI->m_data[7] = in_RDI->m_data[7] * 0.5;
  in_RDI->m_data[8] = in_RDI->m_data[8] * 0.5;
  in_RDI->m_data[9] = in_RDI->m_data[9] * 0.5;
  in_RDI->m_data[10] = in_RDI->m_data[10] * 0.5;
  in_RDI->m_data[0xb] = in_RDI->m_data[0xb] * 0.5;
  return in_RDI;
}

Assistant:

MatrixFixSize<4, 3> Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)
    {
        MatrixFixSize<4, 3> outputMatrix;
        Eigen::Map<Eigen::Matrix<double, 4, 3, Eigen::RowMajor> > map = iDynTree::toEigen(outputMatrix);
        map.topRows<1>() = -iDynTree::toEigen(quaternion).tail<3>().transpose();
        map.bottomRows<3>().setIdentity();
        map.bottomRows<3>() *= quaternion(0);
        map.bottomRows<3>() -= iDynTree::skew(iDynTree::toEigen(quaternion).tail<3>());
        map *= 0.5;
        return outputMatrix;
    }